

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::LowerSetConcatStrMultiItem(Lowerer *this,Instr *instr)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  Instr *pIVar3;
  Opnd *this_00;
  RegOpnd *pRVar4;
  undefined4 *puVar5;
  IndirOpnd *dst;
  IntConstOpnd *dst_00;
  IndirOpnd *src;
  void *var;
  JITJavascriptString *pJVar6;
  Instr *pIVar7;
  HelperCallOpnd *newSrc;
  Instr *local_58;
  Instr *onOverflowInsertBeforeInstr;
  Lowerer *local_48;
  Instr *local_40;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32;
  
  func = this->m_func;
  local_48 = this;
  pIVar3 = (Instr *)IR::Opnd::AsIndirOpnd(instr->m_dst);
  pIVar7 = pIVar3->m_next;
  this_00 = IR::Instr::UnlinkSrc1(instr);
  pRVar4 = IR::Opnd::AsRegOpnd(this_00);
  local_34 = ((ValueType *)&pIVar7->m_noLazyHelperAssert)->field_0;
  bVar2 = ValueType::IsString((ValueType *)&local_34.field_0);
  local_40 = pIVar7;
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x661c,"(concatStrOpnd->GetValueType().IsString())",
                       "concatStrOpnd->GetValueType().IsString()");
    if (!bVar2) goto LAB_00561300;
    *puVar5 = 0;
  }
  pIVar7 = local_40;
  local_32 = (pRVar4->super_Opnd).m_valueType.field_0;
  bVar2 = ValueType::IsString((ValueType *)&local_32.field_0);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x661d,"(srcOpnd->GetValueType().IsString())",
                       "srcOpnd->GetValueType().IsString()");
    if (!bVar2) {
LAB_00561300:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    pIVar7 = local_40;
  }
  onOverflowInsertBeforeInstr = pIVar3;
  pRVar4 = GenerateGetImmutableOrScriptUnreferencedString
                     (local_48,pRVar4,instr,HelperOp_CompoundStringCloneForConcat,false,true);
  IR::Instr::SetSrc1(instr,&pRVar4->super_Opnd);
  dst = IR::IndirOpnd::New((RegOpnd *)pIVar7,0x18,TyUint32,func,false);
  if ((pRVar4->m_sym->field_0x19 & 4) == 0) {
    dst_00 = (IntConstOpnd *)IR::RegOpnd::New(TyUint32,func);
    src = IR::IndirOpnd::New(pRVar4,0x18,TyUint32,func,false);
    InsertMove((Opnd *)dst_00,&src->super_Opnd,instr,true);
  }
  else {
    var = StackSym::GetConstAddress(pRVar4->m_sym,true);
    pJVar6 = JITJavascriptString::FromVar(var);
    dst_00 = IR::IntConstOpnd::New((ulong)pJVar6->m_charLength,TyUint32,func,false);
  }
  InsertAddWithOverflowCheck
            (false,&dst->super_Opnd,&dst->super_Opnd,&dst_00->super_Opnd,instr,&local_58);
  pIVar7 = IR::Instr::New(Call,func);
  newSrc = IR::HelperCallOpnd::New(HelperOp_OutOfMemoryError,func);
  IR::Instr::SetSrc1(pIVar7,&newSrc->super_Opnd);
  IR::Instr::InsertBefore(instr,local_58);
  IR::Instr::InsertBefore(local_58,pIVar7);
  LowererMD::LowerCall(&local_48->m_lowererMD,pIVar7,0);
  *(int *)&onOverflowInsertBeforeInstr->m_func =
       *(int *)&onOverflowInsertBeforeInstr->m_func * 8 + 0x30;
  *(undefined1 *)((long)&onOverflowInsertBeforeInstr->bailOutByteCodeLocation + 2) = 0;
  LowererMD::ChangeToWriteBarrierAssign(instr,func);
  return;
}

Assistant:

void
Lowerer::LowerSetConcatStrMultiItem(IR::Instr * instr)
{
    Func * func = this->m_func;
    IR::IndirOpnd * dstOpnd = instr->GetDst()->AsIndirOpnd();
    IR::RegOpnd * concatStrOpnd = dstOpnd->GetBaseOpnd();
    IR::RegOpnd * srcOpnd = instr->UnlinkSrc1()->AsRegOpnd();

    Assert(concatStrOpnd->GetValueType().IsString());
    Assert(srcOpnd->GetValueType().IsString());
    srcOpnd = GenerateGetImmutableOrScriptUnreferencedString(srcOpnd, instr, IR::HelperOp_CompoundStringCloneForConcat);
    instr->SetSrc1(srcOpnd);

    IR::IndirOpnd * dstLength = IR::IndirOpnd::New(concatStrOpnd, Js::ConcatStringMulti::GetOffsetOfcharLength(), TyUint32, func);
    IR::Opnd * srcLength;

    if (srcOpnd->m_sym->m_isStrConst)
    {
        srcLength = IR::IntConstOpnd::New(JITJavascriptString::FromVar(srcOpnd->m_sym->GetConstAddress(true))->GetLength(), TyUint32, func);
    }
    else
    {
        srcLength = IR::RegOpnd::New(TyUint32, func);
        InsertMove(srcLength, IR::IndirOpnd::New(srcOpnd, Js::ConcatStringMulti::GetOffsetOfcharLength(), TyUint32, func), instr);
    }

    IR::Instr *onOverflowInsertBeforeInstr;
    InsertAddWithOverflowCheck(false, dstLength, dstLength, srcLength, instr, &onOverflowInsertBeforeInstr);
    IR::Instr* callInstr = IR::Instr::New(Js::OpCode::Call, func);
    callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::HelperOp_OutOfMemoryError, func));

    instr->InsertBefore(onOverflowInsertBeforeInstr);
    onOverflowInsertBeforeInstr->InsertBefore(callInstr);
    this->m_lowererMD.LowerCall(callInstr, 0);
    dstOpnd->SetOffset(dstOpnd->GetOffset() * sizeof(Js::JavascriptString *) + Js::ConcatStringMulti::GetOffsetOfSlots());

    LowererMD::ChangeToWriteBarrierAssign(instr, func);
}